

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::getLineContinuationString_abi_cxx11_
          (string *__return_storage_ptr__,LineContinuationTest *this)

{
  uint uVar1;
  uint local_30;
  GLuint i;
  GLuint n_repetitions;
  GLchar *selected_string;
  LineContinuationTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = 0x14;
  if ((this->m_test_case).m_repetitions == 0) {
    uVar1 = 1;
  }
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LineContinuationTest::getLineContinuationString() const
{
	static const GLchar line_continuation_ending_dos[]  = { '\\', 0x0d, 0x0a, 0x00 };
	static const GLchar line_continuation_ending_unix[] = { '\\', 0x0a, 0x00 };

	std::string   result;
	const GLchar* selected_string;

	if (DOS == m_test_case.m_line_endings)
	{
		selected_string = line_continuation_ending_dos;
	}
	else
	{
		selected_string = line_continuation_ending_unix;
	}

	GLuint n_repetitions = (ONCE == m_test_case.m_repetitions) ? 1 : m_n_repetitions;

	for (GLuint i = 0; i < n_repetitions; ++i)
	{
		result.append(selected_string);
	}

	return result;
}